

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O2

void Json_Extract(char *pFileName,Abc_Nam_t *pStr,Vec_Wec_t *vObjs)

{
  uint in_EAX;
  FILE *__s;
  Vec_Int_t *vArray;
  ulong uStack_28;
  int Count;
  
  uStack_28 = (ulong)in_EAX;
  __s = fopen(pFileName,"wb");
  if (__s != (FILE *)0x0) {
    fwrite("# Data extracted from JSON file:\n",0x21,1,__s);
    vArray = Vec_WecEntry(vObjs,0);
    Json_Extract_rec((FILE *)__s,pStr,vObjs,vArray,0,&Count);
    fputc(10,__s);
    fclose(__s);
    return;
  }
  printf("Cannot open file \"%s\" for writing.\n",pFileName);
  return;
}

Assistant:

void Json_Extract( char * pFileName, Abc_Nam_t * pStr, Vec_Wec_t * vObjs )
{
    int Count = 0;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    fprintf( pFile, "# Data extracted from JSON file:\n" );
    Json_Extract_rec( pFile, pStr, vObjs, Vec_WecEntry(vObjs, 0), 0, &Count );
    fprintf( pFile, "\n" );
    fclose( pFile );
}